

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

int conf_parse_pair(char *key,size_t key_len,char *val,size_t val_len,proxy_conf *conf,
                   log_handle *log)

{
  size_t sVar1;
  int iVar2;
  char **ppcVar3;
  char *pcVar4;
  bool bVar5;
  size_t k;
  size_t j;
  size_t i;
  log_handle *plStack_40;
  char dummy [2];
  log_handle *log_local;
  proxy_conf *conf_local;
  size_t val_len_local;
  char *val_local;
  size_t key_len_local;
  char *key_local;
  
  plStack_40 = log;
  switch(key_len) {
  case 4:
    iVar2 = strncmp(key,"Port",key_len);
    if ((iVar2 == 0) && (iVar2 = __isoc99_sscanf(val,"%hu%1s",&conf->port,(long)&i + 6), iVar2 != 1)
       ) {
      log_printf(plStack_40,LOG_LEVEL_ERROR,"Invalid configuration value for \'Port\': \'%.*s\'\n",
                 val_len & 0xffffffff,val);
      return -0x16;
    }
    break;
  case 8:
    iVar2 = strncmp(key,"Password",key_len);
    if (iVar2 == 0) {
      if (conf->password != (char *)0x0) {
        free(conf->password);
      }
      pcVar4 = (char *)malloc(val_len + 1);
      conf->password = pcVar4;
      if (conf->password == (char *)0x0) {
        return -0xc;
      }
      memcpy(conf->password,val,val_len);
      conf->password[val_len] = '\0';
      iVar2 = strcmp(conf->password,"notset");
      if (iVar2 == 0) {
        free(conf->password);
        conf->password = (char *)0x0;
        log_printf(plStack_40,LOG_LEVEL_ERROR,"Error: Missing password\n");
        return -0x16;
      }
    }
    break;
  case 0xb:
    iVar2 = strncmp(key,"BindAddress",key_len);
    if (iVar2 == 0) {
      if (conf->bind_addr != (char *)0x0) {
        free(conf->bind_addr);
      }
      if (val_len == 0) {
        conf->bind_addr = (char *)0x0;
      }
      else {
        pcVar4 = (char *)malloc(val_len + 1);
        conf->bind_addr = pcVar4;
        if (conf->bind_addr == (char *)0x0) {
          return -0xc;
        }
        memcpy(conf->bind_addr,val,val_len);
        conf->bind_addr[val_len] = '\0';
      }
    }
    break;
  case 0xd:
    iVar2 = strncmp(key,"PublicAddress",key_len);
    if (iVar2 == 0) {
      if (conf->public_addr != (char *)0x0) {
        free(conf->public_addr);
      }
      if (val_len == 0) {
        conf->public_addr = (char *)0x0;
      }
      else {
        pcVar4 = (char *)malloc(val_len + 1);
        conf->public_addr = pcVar4;
        if (conf->public_addr == (char *)0x0) {
          return -0xc;
        }
        memcpy(conf->public_addr,val,val_len);
        conf->public_addr[val_len] = '\0';
      }
    }
    break;
  case 0xf:
    iVar2 = strncmp(key,"CallsignsDenied",key_len);
    if (iVar2 == 0) {
      if (conf->calls_denied != (char *)0x0) {
        free(conf->calls_denied);
      }
      if (val_len == 0) {
        conf->calls_denied = (char *)0x0;
      }
      else {
        pcVar4 = (char *)malloc(val_len + 1);
        conf->calls_denied = pcVar4;
        if (conf->calls_denied == (char *)0x0) {
          return -0xc;
        }
        memcpy(conf->calls_denied,val,val_len);
        conf->calls_denied[val_len] = '\0';
      }
    }
    break;
  case 0x10:
    iVar2 = strncmp(key,"CallsignsAllowed",key_len);
    if (iVar2 == 0) {
      if (conf->calls_allowed != (char *)0x0) {
        free(conf->calls_allowed);
      }
      if (val_len == 0) {
        conf->calls_allowed = (char *)0x0;
      }
      else {
        pcVar4 = (char *)malloc(val_len + 1);
        conf->calls_allowed = pcVar4;
        if (conf->calls_allowed == (char *)0x0) {
          return -0xc;
        }
        memcpy(conf->calls_allowed,val,val_len);
        conf->calls_allowed[val_len] = '\0';
      }
    }
    else {
      iVar2 = strncmp(key,"RegistrationName",key_len);
      if (iVar2 == 0) {
        if (conf->reg_name != (char *)0x0) {
          free(conf->reg_name);
        }
        if (val_len == 0) {
          conf->reg_name = (char *)0x0;
        }
        else {
          pcVar4 = (char *)malloc(val_len + 1);
          conf->reg_name = pcVar4;
          if (conf->reg_name == (char *)0x0) {
            return -0xc;
          }
          memcpy(conf->reg_name,val,val_len);
          conf->reg_name[val_len] = '\0';
        }
      }
    }
    break;
  case 0x11:
    iVar2 = strncmp(key,"ConnectionTimeout",key_len);
    if ((iVar2 == 0) &&
       (iVar2 = __isoc99_sscanf(val,"%u%1s",&conf->connection_timeout,(long)&i + 6), iVar2 != 1)) {
      log_printf(plStack_40,LOG_LEVEL_ERROR,
                 "Invalid configuration value for \'ConnectionTimeout\': \'%.*s\'\n",
                 val_len & 0xffffffff,val);
      return -0x16;
    }
    break;
  case 0x13:
    iVar2 = strncmp(key,"ExternalBindAddress",key_len);
    if (iVar2 == 0) {
      if (conf->bind_addr_ext != (char *)0x0) {
        free(conf->bind_addr_ext);
      }
      if (val_len == 0) {
        conf->bind_addr_ext = (char *)0x0;
      }
      else {
        pcVar4 = (char *)malloc(val_len + 1);
        conf->bind_addr_ext = pcVar4;
        if (conf->bind_addr_ext == (char *)0x0) {
          return -0xc;
        }
        memcpy(conf->bind_addr_ext,val,val_len);
        conf->bind_addr_ext[val_len] = '\0';
      }
    }
    else {
      iVar2 = strncmp(key,"RegistrationComment",key_len);
      if (iVar2 == 0) {
        if (conf->reg_comment != (char *)0x0) {
          free(conf->reg_comment);
        }
        if (val_len == 0) {
          conf->reg_comment = (char *)0x0;
        }
        else {
          pcVar4 = (char *)malloc(val_len + 1);
          conf->reg_comment = pcVar4;
          if (conf->reg_comment == (char *)0x0) {
            return -0xc;
          }
          memcpy(conf->reg_comment,val,val_len);
          conf->reg_comment[val_len] = '\0';
        }
      }
    }
    break;
  case 0x1f:
    iVar2 = strncmp(key,"AdditionalExternalBindAddresses",key_len);
    if (iVar2 == 0) {
      if (conf->bind_addr_ext_add != (char **)0x0) {
        free(conf->bind_addr_ext_add);
      }
      if (val_len == 0) {
        conf->bind_addr_ext_add = (char **)0x0;
        conf->bind_addr_ext_add_len = 0;
      }
      else {
        for (j = 1; j < val_len; j = j + 1) {
          if (val[j] == ',') {
            conf->bind_addr_ext_add_len = conf->bind_addr_ext_add_len + 1;
          }
        }
        conf->bind_addr_ext_add_len = conf->bind_addr_ext_add_len + 1;
        ppcVar3 = (char **)calloc((ulong)conf->bind_addr_ext_add_len,8);
        conf->bind_addr_ext_add = ppcVar3;
        if (conf->bind_addr_ext_add == (char **)0x0) {
          return -0xc;
        }
        k = 0;
        for (j = 0; sVar1 = k, j < conf->bind_addr_ext_add_len; j = j + 1) {
          while( true ) {
            bVar5 = false;
            if (k < val_len) {
              bVar5 = val[k] != ',';
            }
            if (!bVar5) break;
            k = k + 1;
          }
          pcVar4 = (char *)malloc((k - sVar1) + 1);
          conf->bind_addr_ext_add[j] = pcVar4;
          if (conf->bind_addr_ext_add[j] == (char *)0x0) {
            for (j = 0; j < conf->bind_addr_ext_add_len; j = j + 1) {
              if (conf->bind_addr_ext_add[j] != (char *)0x0) {
                free(conf->bind_addr_ext_add[j]);
              }
            }
            free(conf->bind_addr_ext_add);
            conf->bind_addr_ext_add = (char **)0x0;
            conf->bind_addr_ext_add_len = 0;
            return -0xc;
          }
          memcpy(conf->bind_addr_ext_add[j],val + sVar1,k - sVar1);
          conf->bind_addr_ext_add[j][k - sVar1] = '\0';
          k = k + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int conf_parse_pair(const char *key, size_t key_len,
			   const char *val, size_t val_len,
			   struct proxy_conf *conf, struct log_handle *log)
{
	char dummy[2];

	switch (key_len) {
	case 4:
		if (strncmp(key, "Port", key_len) == 0) {
			if (sscanf(val, "%hu%1s", &conf->port, dummy) != 1) {
				log_printf(log, LOG_LEVEL_ERROR,
					   "Invalid configuration value for 'Port': '%.*s'\n",
					   (int)val_len, val);

				return -EINVAL;
			}
		}

		break;
	case 8:
		if (strncmp(key, "Password", key_len) == 0) {
			if (conf->password != NULL)
				free(conf->password);

			conf->password = malloc(val_len + 1);
			if (conf->password == NULL)
				return -ENOMEM;

			memcpy(conf->password, val, val_len);
			conf->password[val_len] = '\0';

			if (strcmp(conf->password, "notset") == 0) {
				free(conf->password);
				conf->password = NULL;

				log_printf(log, LOG_LEVEL_ERROR,
					   "Error: Missing password\n");

				return -EINVAL;
			}
		}

		break;
	case 11:
		if (strncmp(key, "BindAddress", key_len) == 0) {
			if (conf->bind_addr != NULL)
				free(conf->bind_addr);

			if (val_len == 0) {
				conf->bind_addr = NULL;
				break;
			}

			conf->bind_addr = malloc(val_len + 1);
			if (conf->bind_addr == NULL)
				return -ENOMEM;

			memcpy(conf->bind_addr, val, val_len);
			conf->bind_addr[val_len] = '\0';
		}

		break;
	case 13:
		if (strncmp(key, "PublicAddress", key_len) == 0) {
			if (conf->public_addr != NULL)
				free(conf->public_addr);

			if (val_len == 0) {
				conf->public_addr = NULL;
				break;
			}

			conf->public_addr = malloc(val_len + 1);
			if (conf->public_addr == NULL)
				return -ENOMEM;

			memcpy(conf->public_addr, val, val_len);
			conf->public_addr[val_len] = '\0';
		}

		break;
	case 15:
		if (strncmp(key, "CallsignsDenied", key_len) == 0) {
			if (conf->calls_denied != NULL)
				free(conf->calls_denied);

			if (val_len == 0) {
				conf->calls_denied = NULL;
				break;
			}

			conf->calls_denied = malloc(val_len + 1);
			if (conf->calls_denied == NULL)
				return -ENOMEM;

			memcpy(conf->calls_denied, val, val_len);
			conf->calls_denied[val_len] = '\0';
		}

		break;
	case 16:
		if (strncmp(key, "CallsignsAllowed", key_len) == 0) {
			if (conf->calls_allowed != NULL)
				free(conf->calls_allowed);

			if (val_len == 0) {
				conf->calls_allowed = NULL;
				break;
			}

			conf->calls_allowed = malloc(val_len + 1);
			if (conf->calls_allowed == NULL)
				return -ENOMEM;

			memcpy(conf->calls_allowed, val, val_len);
			conf->calls_allowed[val_len] = '\0';
		} else if (strncmp(key, "RegistrationName", key_len) == 0) {
			if (conf->reg_name != NULL)
				free(conf->reg_name);

			if (val_len == 0) {
				conf->reg_name = NULL;
				break;
			}

			conf->reg_name = malloc(val_len + 1);
			if (conf->reg_name == NULL)
				return -ENOMEM;

			memcpy(conf->reg_name, val, val_len);
			conf->reg_name[val_len] = '\0';
		}

		break;
	case 17:
		if (strncmp(key, "ConnectionTimeout", key_len) == 0) {
			if (sscanf(val, "%u%1s", &conf->connection_timeout, dummy) != 1) {
				log_printf(log, LOG_LEVEL_ERROR,
					   "Invalid configuration value for 'ConnectionTimeout': '%.*s'\n",
					   (int)val_len, val);

				return -EINVAL;
			}
		}

		break;
	case 19:
		if (strncmp(key, "ExternalBindAddress", key_len) == 0) {
			if (conf->bind_addr_ext != NULL)
				free(conf->bind_addr_ext);

			if (val_len == 0) {
				conf->bind_addr_ext = NULL;
				break;
			}

			conf->bind_addr_ext = malloc(val_len + 1);
			if (conf->bind_addr_ext == NULL)
				return -ENOMEM;

			memcpy(conf->bind_addr_ext, val, val_len);
			conf->bind_addr_ext[val_len] = '\0';
		} else if (strncmp(key, "RegistrationComment", key_len) == 0) {
			if (conf->reg_comment != NULL)
				free(conf->reg_comment);

			if (val_len == 0) {
				conf->reg_comment = NULL;
				break;
			}

			conf->reg_comment = malloc(val_len + 1);
			if (conf->reg_comment == NULL)
				return -ENOMEM;

			memcpy(conf->reg_comment, val, val_len);
			conf->reg_comment[val_len] = '\0';
		}

		break;
	case 31:
		if (strncmp(key, "AdditionalExternalBindAddresses", key_len) == 0) {
			size_t i, j;

			if (conf->bind_addr_ext_add != NULL)
				free(conf->bind_addr_ext_add);

			if (val_len == 0) {
				conf->bind_addr_ext_add = NULL;
				conf->bind_addr_ext_add_len = 0;
				break;
			}

			for (i = 1; i < val_len; i++)
				if (val[i] == ',')
					conf->bind_addr_ext_add_len++;

			conf->bind_addr_ext_add_len++;

			conf->bind_addr_ext_add = calloc(
				conf->bind_addr_ext_add_len,
				sizeof(*conf->bind_addr_ext_add));
			if (conf->bind_addr_ext_add == NULL)
				return -ENOMEM;

			for (i = 0, j = 0; i < conf->bind_addr_ext_add_len; i++) {
				size_t k = j;

				while (j < val_len && val[j] != ',')
					j++;

				conf->bind_addr_ext_add[i] = malloc(j - k + 1);
				if (conf->bind_addr_ext_add[i] == NULL)
					goto bind_addr_ext_add_exit;

				memcpy(conf->bind_addr_ext_add[i], &val[k], j - k);
				conf->bind_addr_ext_add[i][j - k] = '\0';

				j++;
			}

			break;

bind_addr_ext_add_exit:
			for (i = 0; i < conf->bind_addr_ext_add_len; i++)
				if (conf->bind_addr_ext_add[i] != NULL)
					free(conf->bind_addr_ext_add[i]);

			free(conf->bind_addr_ext_add);
			conf->bind_addr_ext_add = NULL;
			conf->bind_addr_ext_add_len = 0;

			return -ENOMEM;
		}
	}

	return 0;
}